

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O2

void __thiscall luna::Closure::AddUpvalue(Closure *this,Upvalue *upvalue)

{
  Upvalue *local_8;
  
  local_8 = upvalue;
  std::vector<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>::push_back
            (&this->upvalues_,&local_8);
  return;
}

Assistant:

void AddUpvalue(Upvalue *upvalue)
        { upvalues_.push_back(upvalue); }